

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransformAnimationNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 *puVar1;
  size_type *psVar2;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  TransformNode *this_00;
  runtime_error *prVar6;
  long *in_RDX;
  undefined8 uVar7;
  char *pcVar8;
  ulong uVar9;
  size_type sVar10;
  long lVar11;
  string sStack_c8;
  Ref<embree::SceneGraph::Node> child;
  undefined8 uStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_88;
  undefined1 local_78 [40];
  string local_50;
  
  uVar9 = *(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3;
  if (uVar9 < 2) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&sStack_c8,(ParseLocation *)(*in_RDX + 0x10));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                   &sStack_c8,": invalid TransformAnimation node");
    std::runtime_error::runtime_error(prVar6,(string *)&child);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sStack_c8.field_2._8_8_ = (void *)0x0;
  sStack_c8._M_string_length = 0;
  sStack_c8.field_2._M_allocated_capacity = 0;
  sVar10 = uVar9 - 1;
  if (sVar10 != 0) {
    sStack_c8.field_2._8_8_ = alignedMalloc(sVar10 * 0x40,0x10);
    sStack_c8.field_2._M_allocated_capacity = sVar10;
  }
  lVar11 = 0;
  bVar5 = false;
  uVar9 = 0;
  uVar7 = sStack_c8.field_2._8_8_;
  sStack_c8._M_string_length = sStack_c8.field_2._M_allocated_capacity;
  do {
    plVar3 = *(long **)(*in_RDX + 0x80);
    if ((*(long *)(*in_RDX + 0x88) - (long)plVar3 >> 3) - 1U <= uVar9) {
      loadNode((XMLLoader *)&child,xml);
      this_00 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
      SceneGraph::TransformNode::TransformNode(this_00,(avector<AffineSpace3ff> *)&sStack_c8,&child)
      ;
      (this_00->spaces).quaternion = bVar5;
      (this->path).filename._M_dataplus._M_p = (pointer)this_00;
      (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
      if (child.ptr != (Node *)0x0) {
        (*((child.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      alignedFree((void *)sStack_c8.field_2._8_8_);
      return (Ref<embree::SceneGraph::Node>)(Node *)this;
    }
    pcVar8 = "AffineSpace";
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*plVar3 + 0x30),"AffineSpace");
    if (bVar4) {
      load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                ((AffineSpace3fa *)&child,(XMLLoader *)pcVar8,
                 (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar11));
      puVar1 = (undefined8 *)(sStack_c8.field_2._8_8_ + lVar11 * 8);
      *puVar1 = child.ptr;
      puVar1[1] = uStack_a0;
      psVar2 = (size_type *)(sStack_c8.field_2._8_8_ + 0x10 + lVar11 * 8);
      *psVar2 = local_98._M_allocated_capacity;
      psVar2[1] = local_98._8_8_;
      puVar1 = (undefined8 *)(sStack_c8.field_2._8_8_ + 0x20 + lVar11 * 8);
      *puVar1 = local_88._0_8_;
      puVar1[1] = local_88._8_8_;
      puVar1 = (undefined8 *)(sStack_c8.field_2._8_8_ + 0x30 + lVar11 * 8);
      *puVar1 = local_78._0_8_;
      puVar1[1] = local_78._8_8_;
      uVar7 = sStack_c8.field_2._8_8_;
    }
    else {
      pcVar8 = "Quaternion";
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (**(long **)(*in_RDX + 0x80) + 0x30),"Quaternion");
      if (!bVar5) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                       &local_50,": unknown transformation representation");
        std::runtime_error::runtime_error(prVar6,(string *)&child);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      loadQuaternion((AffineSpace3ff *)&child,(XMLLoader *)pcVar8,
                     (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar11));
      puVar1 = (undefined8 *)(uVar7 + lVar11 * 8);
      *puVar1 = child.ptr;
      puVar1[1] = uStack_a0;
      psVar2 = (size_type *)(uVar7 + lVar11 * 8 + 0x10);
      *psVar2 = local_98._M_allocated_capacity;
      psVar2[1] = local_98._8_8_;
      puVar1 = (undefined8 *)(uVar7 + lVar11 * 8 + 0x20);
      *puVar1 = local_88._0_8_;
      puVar1[1] = local_88._8_8_;
      puVar1 = (undefined8 *)(uVar7 + lVar11 * 8 + 0x30);
      *puVar1 = local_78._0_8_;
      puVar1[1] = local_78._8_8_;
      bVar5 = true;
    }
    uVar9 = uVar9 + 1;
    lVar11 = lVar11 + 8;
  } while( true );
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransformAnimationNode(const Ref<XML>& xml) 
  {
    if (xml->size() < 2) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid TransformAnimation node");

    bool quaternion = false;
    avector<AffineSpace3ff> spaces(xml->size()-1);
    for (size_t i=0; i<xml->size()-1; i++)
    {
      if (xml->children[0]->name == "AffineSpace") {
        spaces[i] = (AffineSpace3ff) load<AffineSpace3fa>(xml->children[i]);
      }
      else if (xml->children[0]->name == "Quaternion") {
        spaces[i] = loadQuaternion(xml->children[i]);
        quaternion = true;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }

    Ref<SceneGraph::Node> child = loadNode(xml->children[xml->size()-1]);
    auto tnode = new SceneGraph::TransformNode(spaces,child);
    tnode->spaces.quaternion = quaternion;
    return tnode;
  }